

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O1

void base64_stream_encode_ssse3
               (base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  byte bVar1;
  undefined1 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  uint8_t *puVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  long lVar15;
  uint8_t *puVar16;
  undefined1 (*pauVar17) [16];
  byte bVar18;
  uint uVar19;
  long lVar20;
  size_t sVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  size_t local_50;
  ulong local_48;
  
  uVar19 = state->bytes;
  sVar21 = (size_t)uVar19;
  local_50 = 0;
  bVar18 = state->carry;
  if (sVar21 == 2) goto LAB_001039a8;
  if (uVar19 == 1) goto LAB_0010396d;
  if (uVar19 == 0) {
    do {
      auVar8 = _DAT_0010b300;
      auVar7 = _DAT_0010b2e0;
      auVar6 = _DAT_0010b2c0;
      auVar5 = _DAT_0010b2b0;
      auVar4 = _DAT_0010b2a0;
      auVar3 = _DAT_0010b290;
      local_50 = sVar21;
      local_48 = srclen;
      if (0xf < srclen) {
        uVar11 = (srclen - 4) / 0xc;
        local_48 = srclen + uVar11 * -0xc;
        local_50 = uVar11 * 0x10 + sVar21;
        puVar10 = (uint8_t *)out;
        pauVar14 = (undefined1 (*) [16])src;
        do {
          if (uVar11 < 8) {
            if (3 < uVar11) {
              lVar12 = -4;
              lVar25 = 0x40;
              lVar20 = 0x30;
              lVar24 = 0x24;
              lVar23 = 0x20;
              lVar13 = 0x18;
              lVar9 = 0x10;
              lVar15 = 0xc;
              lVar22 = 0x30;
              puVar16 = puVar10;
              pauVar17 = pauVar14;
              goto LAB_0010373d;
            }
            src = *pauVar14 + 0xc;
            out = (char *)(puVar10 + 0x10);
            auVar26 = pshufb(*pauVar14,auVar3);
            auVar43 = pmulhuw(auVar26 & auVar4,auVar5);
            auVar26 = auVar26 & auVar6;
            auVar35._0_2_ = auVar26._0_2_ * 0x10;
            auVar35._2_2_ = auVar26._2_2_ * 0x100;
            auVar35._4_2_ = auVar26._4_2_ * 0x10;
            auVar35._6_2_ = auVar26._6_2_ * 0x100;
            auVar35._8_2_ = auVar26._8_2_ * 0x10;
            auVar35._10_2_ = auVar26._10_2_ * 0x100;
            auVar35._12_2_ = auVar26._12_2_ * 0x10;
            auVar35._14_2_ = auVar26._14_2_ * 0x100;
            auVar35 = auVar35 | auVar43;
            auVar26 = psubusb(auVar35,auVar7);
            auVar43[0] = auVar26[0] + ('\x19' < auVar35[0]);
            auVar43[1] = auVar26[1] + ('\x19' < auVar35[1]);
            auVar43[2] = auVar26[2] + ('\x19' < auVar35[2]);
            auVar43[3] = auVar26[3] + ('\x19' < auVar35[3]);
            auVar43[4] = auVar26[4] + ('\x19' < auVar35[4]);
            auVar43[5] = auVar26[5] + ('\x19' < auVar35[5]);
            auVar43[6] = auVar26[6] + ('\x19' < auVar35[6]);
            auVar43[7] = auVar26[7] + ('\x19' < auVar35[7]);
            auVar43[8] = auVar26[8] + ('\x19' < auVar35[8]);
            auVar43[9] = auVar26[9] + ('\x19' < auVar35[9]);
            auVar43[10] = auVar26[10] + ('\x19' < auVar35[10]);
            auVar43[0xb] = auVar26[0xb] + ('\x19' < auVar35[0xb]);
            auVar43[0xc] = auVar26[0xc] + ('\x19' < auVar35[0xc]);
            auVar43[0xd] = auVar26[0xd] + ('\x19' < auVar35[0xd]);
            auVar43[0xe] = auVar26[0xe] + ('\x19' < auVar35[0xe]);
            auVar43[0xf] = auVar26[0xf] + ('\x19' < auVar35[0xf]);
            auVar26 = pshufb(auVar8,auVar43);
            *puVar10 = auVar26[0] + auVar35[0];
            puVar10[1] = auVar26[1] + auVar35[1];
            puVar10[2] = auVar26[2] + auVar35[2];
            puVar10[3] = auVar26[3] + auVar35[3];
            puVar10[4] = auVar26[4] + auVar35[4];
            puVar10[5] = auVar26[5] + auVar35[5];
            puVar10[6] = auVar26[6] + auVar35[6];
            puVar10[7] = auVar26[7] + auVar35[7];
            puVar10[8] = auVar26[8] + auVar35[8];
            puVar10[9] = auVar26[9] + auVar35[9];
            puVar10[10] = auVar26[10] + auVar35[10];
            puVar10[0xb] = auVar26[0xb] + auVar35[0xb];
            puVar10[0xc] = auVar26[0xc] + auVar35[0xc];
            puVar10[0xd] = auVar26[0xd] + auVar35[0xd];
            puVar10[0xe] = auVar26[0xe] + auVar35[0xe];
            puVar10[0xf] = auVar26[0xf] + auVar35[0xf];
            if (uVar11 < 2) break;
            lVar12 = -2;
            lVar25 = 0x20;
            lVar22 = 0x18;
          }
          else {
            auVar26 = pshufb(*pauVar14,auVar3);
            auVar35 = pmulhuw(auVar26 & auVar4,auVar5);
            auVar26 = auVar26 & auVar6;
            auVar27._0_2_ = auVar26._0_2_ * 0x10;
            auVar27._2_2_ = auVar26._2_2_ * 0x100;
            auVar27._4_2_ = auVar26._4_2_ * 0x10;
            auVar27._6_2_ = auVar26._6_2_ * 0x100;
            auVar27._8_2_ = auVar26._8_2_ * 0x10;
            auVar27._10_2_ = auVar26._10_2_ * 0x100;
            auVar27._12_2_ = auVar26._12_2_ * 0x10;
            auVar27._14_2_ = auVar26._14_2_ * 0x100;
            auVar27 = auVar27 | auVar35;
            auVar26 = psubusb(auVar27,auVar7);
            auVar36[0] = auVar26[0] + ('\x19' < auVar27[0]);
            auVar36[1] = auVar26[1] + ('\x19' < auVar27[1]);
            auVar36[2] = auVar26[2] + ('\x19' < auVar27[2]);
            auVar36[3] = auVar26[3] + ('\x19' < auVar27[3]);
            auVar36[4] = auVar26[4] + ('\x19' < auVar27[4]);
            auVar36[5] = auVar26[5] + ('\x19' < auVar27[5]);
            auVar36[6] = auVar26[6] + ('\x19' < auVar27[6]);
            auVar36[7] = auVar26[7] + ('\x19' < auVar27[7]);
            auVar36[8] = auVar26[8] + ('\x19' < auVar27[8]);
            auVar36[9] = auVar26[9] + ('\x19' < auVar27[9]);
            auVar36[10] = auVar26[10] + ('\x19' < auVar27[10]);
            auVar36[0xb] = auVar26[0xb] + ('\x19' < auVar27[0xb]);
            auVar36[0xc] = auVar26[0xc] + ('\x19' < auVar27[0xc]);
            auVar36[0xd] = auVar26[0xd] + ('\x19' < auVar27[0xd]);
            auVar36[0xe] = auVar26[0xe] + ('\x19' < auVar27[0xe]);
            auVar36[0xf] = auVar26[0xf] + ('\x19' < auVar27[0xf]);
            auVar26 = pshufb(auVar8,auVar36);
            *puVar10 = auVar26[0] + auVar27[0];
            puVar10[1] = auVar26[1] + auVar27[1];
            puVar10[2] = auVar26[2] + auVar27[2];
            puVar10[3] = auVar26[3] + auVar27[3];
            puVar10[4] = auVar26[4] + auVar27[4];
            puVar10[5] = auVar26[5] + auVar27[5];
            puVar10[6] = auVar26[6] + auVar27[6];
            puVar10[7] = auVar26[7] + auVar27[7];
            puVar10[8] = auVar26[8] + auVar27[8];
            puVar10[9] = auVar26[9] + auVar27[9];
            puVar10[10] = auVar26[10] + auVar27[10];
            puVar10[0xb] = auVar26[0xb] + auVar27[0xb];
            puVar10[0xc] = auVar26[0xc] + auVar27[0xc];
            puVar10[0xd] = auVar26[0xd] + auVar27[0xd];
            puVar10[0xe] = auVar26[0xe] + auVar27[0xe];
            puVar10[0xf] = auVar26[0xf] + auVar27[0xf];
            auVar26 = pshufb(*(undefined1 (*) [16])(*pauVar14 + 0xc),auVar3);
            auVar35 = pmulhuw(auVar26 & auVar4,auVar5);
            auVar26 = auVar26 & auVar6;
            auVar28._0_2_ = auVar26._0_2_ * 0x10;
            auVar28._2_2_ = auVar26._2_2_ * 0x100;
            auVar28._4_2_ = auVar26._4_2_ * 0x10;
            auVar28._6_2_ = auVar26._6_2_ * 0x100;
            auVar28._8_2_ = auVar26._8_2_ * 0x10;
            auVar28._10_2_ = auVar26._10_2_ * 0x100;
            auVar28._12_2_ = auVar26._12_2_ * 0x10;
            auVar28._14_2_ = auVar26._14_2_ * 0x100;
            auVar28 = auVar28 | auVar35;
            auVar26 = psubusb(auVar28,auVar7);
            auVar37[0] = auVar26[0] + ('\x19' < auVar28[0]);
            auVar37[1] = auVar26[1] + ('\x19' < auVar28[1]);
            auVar37[2] = auVar26[2] + ('\x19' < auVar28[2]);
            auVar37[3] = auVar26[3] + ('\x19' < auVar28[3]);
            auVar37[4] = auVar26[4] + ('\x19' < auVar28[4]);
            auVar37[5] = auVar26[5] + ('\x19' < auVar28[5]);
            auVar37[6] = auVar26[6] + ('\x19' < auVar28[6]);
            auVar37[7] = auVar26[7] + ('\x19' < auVar28[7]);
            auVar37[8] = auVar26[8] + ('\x19' < auVar28[8]);
            auVar37[9] = auVar26[9] + ('\x19' < auVar28[9]);
            auVar37[10] = auVar26[10] + ('\x19' < auVar28[10]);
            auVar37[0xb] = auVar26[0xb] + ('\x19' < auVar28[0xb]);
            auVar37[0xc] = auVar26[0xc] + ('\x19' < auVar28[0xc]);
            auVar37[0xd] = auVar26[0xd] + ('\x19' < auVar28[0xd]);
            auVar37[0xe] = auVar26[0xe] + ('\x19' < auVar28[0xe]);
            auVar37[0xf] = auVar26[0xf] + ('\x19' < auVar28[0xf]);
            auVar26 = pshufb(auVar8,auVar37);
            puVar10[0x10] = auVar26[0] + auVar28[0];
            puVar10[0x11] = auVar26[1] + auVar28[1];
            puVar10[0x12] = auVar26[2] + auVar28[2];
            puVar10[0x13] = auVar26[3] + auVar28[3];
            puVar10[0x14] = auVar26[4] + auVar28[4];
            puVar10[0x15] = auVar26[5] + auVar28[5];
            puVar10[0x16] = auVar26[6] + auVar28[6];
            puVar10[0x17] = auVar26[7] + auVar28[7];
            puVar10[0x18] = auVar26[8] + auVar28[8];
            puVar10[0x19] = auVar26[9] + auVar28[9];
            puVar10[0x1a] = auVar26[10] + auVar28[10];
            puVar10[0x1b] = auVar26[0xb] + auVar28[0xb];
            puVar10[0x1c] = auVar26[0xc] + auVar28[0xc];
            puVar10[0x1d] = auVar26[0xd] + auVar28[0xd];
            puVar10[0x1e] = auVar26[0xe] + auVar28[0xe];
            puVar10[0x1f] = auVar26[0xf] + auVar28[0xf];
            auVar26 = pshufb(*(undefined1 (*) [16])(pauVar14[1] + 8),auVar3);
            auVar35 = pmulhuw(auVar26 & auVar4,auVar5);
            auVar26 = auVar26 & auVar6;
            auVar29._0_2_ = auVar26._0_2_ * 0x10;
            auVar29._2_2_ = auVar26._2_2_ * 0x100;
            auVar29._4_2_ = auVar26._4_2_ * 0x10;
            auVar29._6_2_ = auVar26._6_2_ * 0x100;
            auVar29._8_2_ = auVar26._8_2_ * 0x10;
            auVar29._10_2_ = auVar26._10_2_ * 0x100;
            auVar29._12_2_ = auVar26._12_2_ * 0x10;
            auVar29._14_2_ = auVar26._14_2_ * 0x100;
            auVar29 = auVar29 | auVar35;
            auVar26 = psubusb(auVar29,auVar7);
            auVar38[0] = auVar26[0] + ('\x19' < auVar29[0]);
            auVar38[1] = auVar26[1] + ('\x19' < auVar29[1]);
            auVar38[2] = auVar26[2] + ('\x19' < auVar29[2]);
            auVar38[3] = auVar26[3] + ('\x19' < auVar29[3]);
            auVar38[4] = auVar26[4] + ('\x19' < auVar29[4]);
            auVar38[5] = auVar26[5] + ('\x19' < auVar29[5]);
            auVar38[6] = auVar26[6] + ('\x19' < auVar29[6]);
            auVar38[7] = auVar26[7] + ('\x19' < auVar29[7]);
            auVar38[8] = auVar26[8] + ('\x19' < auVar29[8]);
            auVar38[9] = auVar26[9] + ('\x19' < auVar29[9]);
            auVar38[10] = auVar26[10] + ('\x19' < auVar29[10]);
            auVar38[0xb] = auVar26[0xb] + ('\x19' < auVar29[0xb]);
            auVar38[0xc] = auVar26[0xc] + ('\x19' < auVar29[0xc]);
            auVar38[0xd] = auVar26[0xd] + ('\x19' < auVar29[0xd]);
            auVar38[0xe] = auVar26[0xe] + ('\x19' < auVar29[0xe]);
            auVar38[0xf] = auVar26[0xf] + ('\x19' < auVar29[0xf]);
            auVar26 = pshufb(auVar8,auVar38);
            puVar10[0x20] = auVar26[0] + auVar29[0];
            puVar10[0x21] = auVar26[1] + auVar29[1];
            puVar10[0x22] = auVar26[2] + auVar29[2];
            puVar10[0x23] = auVar26[3] + auVar29[3];
            puVar10[0x24] = auVar26[4] + auVar29[4];
            puVar10[0x25] = auVar26[5] + auVar29[5];
            puVar10[0x26] = auVar26[6] + auVar29[6];
            puVar10[0x27] = auVar26[7] + auVar29[7];
            puVar10[0x28] = auVar26[8] + auVar29[8];
            puVar10[0x29] = auVar26[9] + auVar29[9];
            puVar10[0x2a] = auVar26[10] + auVar29[10];
            puVar10[0x2b] = auVar26[0xb] + auVar29[0xb];
            puVar10[0x2c] = auVar26[0xc] + auVar29[0xc];
            puVar10[0x2d] = auVar26[0xd] + auVar29[0xd];
            puVar10[0x2e] = auVar26[0xe] + auVar29[0xe];
            puVar10[0x2f] = auVar26[0xf] + auVar29[0xf];
            auVar26 = pshufb(*(undefined1 (*) [16])(pauVar14[2] + 4),auVar3);
            auVar35 = pmulhuw(auVar26 & auVar4,auVar5);
            auVar26 = auVar26 & auVar6;
            auVar30._0_2_ = auVar26._0_2_ * 0x10;
            auVar30._2_2_ = auVar26._2_2_ * 0x100;
            auVar30._4_2_ = auVar26._4_2_ * 0x10;
            auVar30._6_2_ = auVar26._6_2_ * 0x100;
            auVar30._8_2_ = auVar26._8_2_ * 0x10;
            auVar30._10_2_ = auVar26._10_2_ * 0x100;
            auVar30._12_2_ = auVar26._12_2_ * 0x10;
            auVar30._14_2_ = auVar26._14_2_ * 0x100;
            auVar30 = auVar30 | auVar35;
            auVar26 = psubusb(auVar30,auVar7);
            auVar39[0] = auVar26[0] + ('\x19' < auVar30[0]);
            auVar39[1] = auVar26[1] + ('\x19' < auVar30[1]);
            auVar39[2] = auVar26[2] + ('\x19' < auVar30[2]);
            auVar39[3] = auVar26[3] + ('\x19' < auVar30[3]);
            auVar39[4] = auVar26[4] + ('\x19' < auVar30[4]);
            auVar39[5] = auVar26[5] + ('\x19' < auVar30[5]);
            auVar39[6] = auVar26[6] + ('\x19' < auVar30[6]);
            auVar39[7] = auVar26[7] + ('\x19' < auVar30[7]);
            auVar39[8] = auVar26[8] + ('\x19' < auVar30[8]);
            auVar39[9] = auVar26[9] + ('\x19' < auVar30[9]);
            auVar39[10] = auVar26[10] + ('\x19' < auVar30[10]);
            auVar39[0xb] = auVar26[0xb] + ('\x19' < auVar30[0xb]);
            auVar39[0xc] = auVar26[0xc] + ('\x19' < auVar30[0xc]);
            auVar39[0xd] = auVar26[0xd] + ('\x19' < auVar30[0xd]);
            auVar39[0xe] = auVar26[0xe] + ('\x19' < auVar30[0xe]);
            auVar39[0xf] = auVar26[0xf] + ('\x19' < auVar30[0xf]);
            auVar26 = pshufb(auVar8,auVar39);
            puVar10[0x30] = auVar26[0] + auVar30[0];
            puVar10[0x31] = auVar26[1] + auVar30[1];
            puVar10[0x32] = auVar26[2] + auVar30[2];
            puVar10[0x33] = auVar26[3] + auVar30[3];
            puVar10[0x34] = auVar26[4] + auVar30[4];
            puVar10[0x35] = auVar26[5] + auVar30[5];
            puVar10[0x36] = auVar26[6] + auVar30[6];
            puVar10[0x37] = auVar26[7] + auVar30[7];
            puVar10[0x38] = auVar26[8] + auVar30[8];
            puVar10[0x39] = auVar26[9] + auVar30[9];
            puVar10[0x3a] = auVar26[10] + auVar30[10];
            puVar10[0x3b] = auVar26[0xb] + auVar30[0xb];
            puVar10[0x3c] = auVar26[0xc] + auVar30[0xc];
            puVar10[0x3d] = auVar26[0xd] + auVar30[0xd];
            puVar10[0x3e] = auVar26[0xe] + auVar30[0xe];
            puVar10[0x3f] = auVar26[0xf] + auVar30[0xf];
            lVar12 = -8;
            lVar25 = 0x80;
            lVar20 = 0x70;
            lVar24 = 0x54;
            lVar23 = 0x60;
            lVar13 = 0x48;
            lVar9 = 0x50;
            lVar15 = 0x3c;
            lVar22 = 0x60;
            puVar16 = puVar10 + 0x40;
            pauVar17 = pauVar14 + 3;
LAB_0010373d:
            auVar26 = pshufb(*pauVar17,auVar3);
            auVar35 = pmulhuw(auVar26 & auVar4,auVar5);
            auVar26 = auVar26 & auVar6;
            auVar31._0_2_ = auVar26._0_2_ * 0x10;
            auVar31._2_2_ = auVar26._2_2_ * 0x100;
            auVar31._4_2_ = auVar26._4_2_ * 0x10;
            auVar31._6_2_ = auVar26._6_2_ * 0x100;
            auVar31._8_2_ = auVar26._8_2_ * 0x10;
            auVar31._10_2_ = auVar26._10_2_ * 0x100;
            auVar31._12_2_ = auVar26._12_2_ * 0x10;
            auVar31._14_2_ = auVar26._14_2_ * 0x100;
            auVar31 = auVar31 | auVar35;
            auVar26 = psubusb(auVar31,auVar7);
            auVar40[0] = auVar26[0] + ('\x19' < auVar31[0]);
            auVar40[1] = auVar26[1] + ('\x19' < auVar31[1]);
            auVar40[2] = auVar26[2] + ('\x19' < auVar31[2]);
            auVar40[3] = auVar26[3] + ('\x19' < auVar31[3]);
            auVar40[4] = auVar26[4] + ('\x19' < auVar31[4]);
            auVar40[5] = auVar26[5] + ('\x19' < auVar31[5]);
            auVar40[6] = auVar26[6] + ('\x19' < auVar31[6]);
            auVar40[7] = auVar26[7] + ('\x19' < auVar31[7]);
            auVar40[8] = auVar26[8] + ('\x19' < auVar31[8]);
            auVar40[9] = auVar26[9] + ('\x19' < auVar31[9]);
            auVar40[10] = auVar26[10] + ('\x19' < auVar31[10]);
            auVar40[0xb] = auVar26[0xb] + ('\x19' < auVar31[0xb]);
            auVar40[0xc] = auVar26[0xc] + ('\x19' < auVar31[0xc]);
            auVar40[0xd] = auVar26[0xd] + ('\x19' < auVar31[0xd]);
            auVar40[0xe] = auVar26[0xe] + ('\x19' < auVar31[0xe]);
            auVar40[0xf] = auVar26[0xf] + ('\x19' < auVar31[0xf]);
            auVar26 = pshufb(auVar8,auVar40);
            *puVar16 = auVar26[0] + auVar31[0];
            puVar16[1] = auVar26[1] + auVar31[1];
            puVar16[2] = auVar26[2] + auVar31[2];
            puVar16[3] = auVar26[3] + auVar31[3];
            puVar16[4] = auVar26[4] + auVar31[4];
            puVar16[5] = auVar26[5] + auVar31[5];
            puVar16[6] = auVar26[6] + auVar31[6];
            puVar16[7] = auVar26[7] + auVar31[7];
            puVar16[8] = auVar26[8] + auVar31[8];
            puVar16[9] = auVar26[9] + auVar31[9];
            puVar16[10] = auVar26[10] + auVar31[10];
            puVar16[0xb] = auVar26[0xb] + auVar31[0xb];
            puVar16[0xc] = auVar26[0xc] + auVar31[0xc];
            puVar16[0xd] = auVar26[0xd] + auVar31[0xd];
            puVar16[0xe] = auVar26[0xe] + auVar31[0xe];
            puVar16[0xf] = auVar26[0xf] + auVar31[0xf];
            auVar26 = pshufb(*(undefined1 (*) [16])(*pauVar14 + lVar15),auVar3);
            auVar35 = pmulhuw(auVar26 & auVar4,auVar5);
            auVar26 = auVar26 & auVar6;
            auVar32._0_2_ = auVar26._0_2_ * 0x10;
            auVar32._2_2_ = auVar26._2_2_ * 0x100;
            auVar32._4_2_ = auVar26._4_2_ * 0x10;
            auVar32._6_2_ = auVar26._6_2_ * 0x100;
            auVar32._8_2_ = auVar26._8_2_ * 0x10;
            auVar32._10_2_ = auVar26._10_2_ * 0x100;
            auVar32._12_2_ = auVar26._12_2_ * 0x10;
            auVar32._14_2_ = auVar26._14_2_ * 0x100;
            auVar32 = auVar32 | auVar35;
            auVar26 = psubusb(auVar32,auVar7);
            auVar41[0] = auVar26[0] + ('\x19' < auVar32[0]);
            auVar41[1] = auVar26[1] + ('\x19' < auVar32[1]);
            auVar41[2] = auVar26[2] + ('\x19' < auVar32[2]);
            auVar41[3] = auVar26[3] + ('\x19' < auVar32[3]);
            auVar41[4] = auVar26[4] + ('\x19' < auVar32[4]);
            auVar41[5] = auVar26[5] + ('\x19' < auVar32[5]);
            auVar41[6] = auVar26[6] + ('\x19' < auVar32[6]);
            auVar41[7] = auVar26[7] + ('\x19' < auVar32[7]);
            auVar41[8] = auVar26[8] + ('\x19' < auVar32[8]);
            auVar41[9] = auVar26[9] + ('\x19' < auVar32[9]);
            auVar41[10] = auVar26[10] + ('\x19' < auVar32[10]);
            auVar41[0xb] = auVar26[0xb] + ('\x19' < auVar32[0xb]);
            auVar41[0xc] = auVar26[0xc] + ('\x19' < auVar32[0xc]);
            auVar41[0xd] = auVar26[0xd] + ('\x19' < auVar32[0xd]);
            auVar41[0xe] = auVar26[0xe] + ('\x19' < auVar32[0xe]);
            auVar41[0xf] = auVar26[0xf] + ('\x19' < auVar32[0xf]);
            auVar26 = pshufb(auVar8,auVar41);
            puVar16 = puVar10 + lVar9;
            *puVar16 = auVar26[0] + auVar32[0];
            puVar16[1] = auVar26[1] + auVar32[1];
            puVar16[2] = auVar26[2] + auVar32[2];
            puVar16[3] = auVar26[3] + auVar32[3];
            puVar16[4] = auVar26[4] + auVar32[4];
            puVar16[5] = auVar26[5] + auVar32[5];
            puVar16[6] = auVar26[6] + auVar32[6];
            puVar16[7] = auVar26[7] + auVar32[7];
            puVar16[8] = auVar26[8] + auVar32[8];
            puVar16[9] = auVar26[9] + auVar32[9];
            puVar16[10] = auVar26[10] + auVar32[10];
            puVar16[0xb] = auVar26[0xb] + auVar32[0xb];
            puVar16[0xc] = auVar26[0xc] + auVar32[0xc];
            puVar16[0xd] = auVar26[0xd] + auVar32[0xd];
            puVar16[0xe] = auVar26[0xe] + auVar32[0xe];
            puVar16[0xf] = auVar26[0xf] + auVar32[0xf];
            auVar26 = pshufb(*(undefined1 (*) [16])(*pauVar14 + lVar13),auVar3);
            auVar35 = pmulhuw(auVar26 & auVar4,auVar5);
            auVar26 = auVar26 & auVar6;
            auVar33._0_2_ = auVar26._0_2_ * 0x10;
            auVar33._2_2_ = auVar26._2_2_ * 0x100;
            auVar33._4_2_ = auVar26._4_2_ * 0x10;
            auVar33._6_2_ = auVar26._6_2_ * 0x100;
            auVar33._8_2_ = auVar26._8_2_ * 0x10;
            auVar33._10_2_ = auVar26._10_2_ * 0x100;
            auVar33._12_2_ = auVar26._12_2_ * 0x10;
            auVar33._14_2_ = auVar26._14_2_ * 0x100;
            auVar33 = auVar33 | auVar35;
            auVar26 = psubusb(auVar33,auVar7);
            auVar42[0] = auVar26[0] + ('\x19' < auVar33[0]);
            auVar42[1] = auVar26[1] + ('\x19' < auVar33[1]);
            auVar42[2] = auVar26[2] + ('\x19' < auVar33[2]);
            auVar42[3] = auVar26[3] + ('\x19' < auVar33[3]);
            auVar42[4] = auVar26[4] + ('\x19' < auVar33[4]);
            auVar42[5] = auVar26[5] + ('\x19' < auVar33[5]);
            auVar42[6] = auVar26[6] + ('\x19' < auVar33[6]);
            auVar42[7] = auVar26[7] + ('\x19' < auVar33[7]);
            auVar42[8] = auVar26[8] + ('\x19' < auVar33[8]);
            auVar42[9] = auVar26[9] + ('\x19' < auVar33[9]);
            auVar42[10] = auVar26[10] + ('\x19' < auVar33[10]);
            auVar42[0xb] = auVar26[0xb] + ('\x19' < auVar33[0xb]);
            auVar42[0xc] = auVar26[0xc] + ('\x19' < auVar33[0xc]);
            auVar42[0xd] = auVar26[0xd] + ('\x19' < auVar33[0xd]);
            auVar42[0xe] = auVar26[0xe] + ('\x19' < auVar33[0xe]);
            auVar42[0xf] = auVar26[0xf] + ('\x19' < auVar33[0xf]);
            auVar26 = pshufb(auVar8,auVar42);
            puVar16 = puVar10 + lVar23;
            *puVar16 = auVar26[0] + auVar33[0];
            puVar16[1] = auVar26[1] + auVar33[1];
            puVar16[2] = auVar26[2] + auVar33[2];
            puVar16[3] = auVar26[3] + auVar33[3];
            puVar16[4] = auVar26[4] + auVar33[4];
            puVar16[5] = auVar26[5] + auVar33[5];
            puVar16[6] = auVar26[6] + auVar33[6];
            puVar16[7] = auVar26[7] + auVar33[7];
            puVar16[8] = auVar26[8] + auVar33[8];
            puVar16[9] = auVar26[9] + auVar33[9];
            puVar16[10] = auVar26[10] + auVar33[10];
            puVar16[0xb] = auVar26[0xb] + auVar33[0xb];
            puVar16[0xc] = auVar26[0xc] + auVar33[0xc];
            puVar16[0xd] = auVar26[0xd] + auVar33[0xd];
            puVar16[0xe] = auVar26[0xe] + auVar33[0xe];
            puVar16[0xf] = auVar26[0xf] + auVar33[0xf];
            src = *pauVar14 + lVar24;
            out = (char *)(puVar10 + lVar20);
          }
          auVar26 = pshufb(*(undefined1 (*) [16])src,auVar3);
          auVar35 = pmulhuw(auVar26 & auVar4,auVar5);
          auVar26 = auVar26 & auVar6;
          auVar34._0_2_ = auVar26._0_2_ * 0x10;
          auVar34._2_2_ = auVar26._2_2_ * 0x100;
          auVar34._4_2_ = auVar26._4_2_ * 0x10;
          auVar34._6_2_ = auVar26._6_2_ * 0x100;
          auVar34._8_2_ = auVar26._8_2_ * 0x10;
          auVar34._10_2_ = auVar26._10_2_ * 0x100;
          auVar34._12_2_ = auVar26._12_2_ * 0x10;
          auVar34._14_2_ = auVar26._14_2_ * 0x100;
          auVar34 = auVar34 | auVar35;
          auVar26 = psubusb(auVar34,auVar7);
          auVar44[0] = auVar26[0] + ('\x19' < auVar34[0]);
          auVar44[1] = auVar26[1] + ('\x19' < auVar34[1]);
          auVar44[2] = auVar26[2] + ('\x19' < auVar34[2]);
          auVar44[3] = auVar26[3] + ('\x19' < auVar34[3]);
          auVar44[4] = auVar26[4] + ('\x19' < auVar34[4]);
          auVar44[5] = auVar26[5] + ('\x19' < auVar34[5]);
          auVar44[6] = auVar26[6] + ('\x19' < auVar34[6]);
          auVar44[7] = auVar26[7] + ('\x19' < auVar34[7]);
          auVar44[8] = auVar26[8] + ('\x19' < auVar34[8]);
          auVar44[9] = auVar26[9] + ('\x19' < auVar34[9]);
          auVar44[10] = auVar26[10] + ('\x19' < auVar34[10]);
          auVar44[0xb] = auVar26[0xb] + ('\x19' < auVar34[0xb]);
          auVar44[0xc] = auVar26[0xc] + ('\x19' < auVar34[0xc]);
          auVar44[0xd] = auVar26[0xd] + ('\x19' < auVar34[0xd]);
          auVar44[0xe] = auVar26[0xe] + ('\x19' < auVar34[0xe]);
          auVar44[0xf] = auVar26[0xf] + ('\x19' < auVar34[0xf]);
          auVar26 = pshufb(auVar8,auVar44);
          *out = auVar26[0] + auVar34[0];
          ((uint8_t *)out)[1] = auVar26[1] + auVar34[1];
          ((uint8_t *)out)[2] = auVar26[2] + auVar34[2];
          ((uint8_t *)out)[3] = auVar26[3] + auVar34[3];
          ((uint8_t *)out)[4] = auVar26[4] + auVar34[4];
          ((uint8_t *)out)[5] = auVar26[5] + auVar34[5];
          ((uint8_t *)out)[6] = auVar26[6] + auVar34[6];
          ((uint8_t *)out)[7] = auVar26[7] + auVar34[7];
          ((uint8_t *)out)[8] = auVar26[8] + auVar34[8];
          ((uint8_t *)out)[9] = auVar26[9] + auVar34[9];
          ((uint8_t *)out)[10] = auVar26[10] + auVar34[10];
          ((uint8_t *)out)[0xb] = auVar26[0xb] + auVar34[0xb];
          ((uint8_t *)out)[0xc] = auVar26[0xc] + auVar34[0xc];
          ((uint8_t *)out)[0xd] = auVar26[0xd] + auVar34[0xd];
          ((uint8_t *)out)[0xe] = auVar26[0xe] + auVar34[0xe];
          ((uint8_t *)out)[0xf] = auVar26[0xf] + auVar34[0xf];
          src = *pauVar14 + lVar22;
          out = (char *)(puVar10 + lVar25);
          uVar11 = uVar11 + lVar12;
          puVar10 = (uint8_t *)out;
          pauVar14 = (undefined1 (*) [16])src;
        } while (uVar11 != 0);
      }
      if (local_48 == 0) {
        uVar19 = 0;
        break;
      }
      srclen = local_48 - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(*(undefined1 (*) [16])src)[0] >> 2];
      out = (char *)((uint8_t *)out + 1);
      puVar2 = *(undefined1 (*) [16])src;
      src = *(undefined1 (*) [16])src + 1;
      bVar18 = (*puVar2 & 3) << 4;
      local_50 = local_50 + 1;
LAB_0010396d:
      if (srclen == 0) {
        uVar19 = 1;
        break;
      }
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar18 | (byte)*src >> 4)];
      out = (char *)((uint8_t *)out + 1);
      bVar18 = *src;
      src = (char *)((byte *)src + 1);
      bVar18 = (bVar18 & 0xf) << 2;
      local_50 = local_50 + 1;
LAB_001039a8:
      if (srclen == 0) goto LAB_001039ea;
      srclen = srclen - 1;
      *out = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(byte)(bVar18 | (byte)*src >> 6)];
      bVar1 = *src;
      src = (char *)((byte *)src + 1);
      ((uint8_t *)out)[1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 & 0x3f];
      out = (char *)((uint8_t *)out + 2);
      sVar21 = local_50 + 2;
    } while( true );
  }
LAB_001039fd:
  state->bytes = uVar19;
  state->carry = bVar18;
  *outlen = local_50;
  return;
LAB_001039ea:
  uVar19 = 2;
  goto LAB_001039fd;
}

Assistant:

BASE64_ENC_FUNCTION(ssse3)
{
#if HAVE_SSSE3
	#include "../generic/enc_head.c"
	enc_loop_ssse3(&s, &slen, &o, &olen);
	#include "../generic/enc_tail.c"
#else
	BASE64_ENC_STUB
#endif
}